

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_mtree.c
# Opt level: O0

int get_path_component(char *name,size_t n,char *fn)

{
  char *pcVar1;
  char *in_RDX;
  long in_RSI;
  void *in_RDI;
  size_t l;
  char *p;
  ulong local_30;
  int local_4;
  
  pcVar1 = strchr(in_RDX,0x2f);
  if (pcVar1 == (char *)0x0) {
    local_30 = strlen(in_RDX);
    if (local_30 == 0) {
      return 0;
    }
  }
  else {
    local_30 = (long)pcVar1 - (long)in_RDX;
  }
  if (in_RSI - 1U < local_30) {
    local_4 = -1;
  }
  else {
    memcpy(in_RDI,in_RDX,local_30);
    *(undefined1 *)((long)in_RDI + local_30) = 0;
    local_4 = (int)local_30;
  }
  return local_4;
}

Assistant:

static int
get_path_component(char *name, size_t n, const char *fn)
{
	char *p;
	size_t l;

	p = strchr(fn, '/');
	if (p == NULL) {
		if ((l = strlen(fn)) == 0)
			return (0);
	} else
		l = p - fn;
	if (l > n -1)
		return (-1);
	memcpy(name, fn, l);
	name[l] = '\0';

	return ((int)l);
}